

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

void ht_init(int argc,char **argv)

{
  ht_command_line_parse_args(argc,argv);
  ht_registry_init();
  ht_HT_EndiannessInfoEvent_register_event_klass();
  ht_HT_Event_register_event_klass();
  ht_HT_EventKlassInfoEvent_register_event_klass();
  ht_HT_EventKlassFieldInfoEvent_register_event_klass();
  ht_HT_CallstackBaseEvent_register_event_klass();
  ht_HT_CallstackIntEvent_register_event_klass();
  ht_HT_CallstackStringEvent_register_event_klass();
  ht_HT_StringMappingEvent_register_event_klass();
  ht_HT_SystemInfoEvent_register_event_klass();
  ht_feature_register_core_features();
  _ht_posix_mapped_tracepoint_init();
  _ht_init_counter = _ht_init_counter + 1;
  return;
}

Assistant:

void
ht_init(int argc, char** argv)
{
    ht_command_line_parse_args(argc, argv);

    ht_registry_init();

    HT_REGISTER_EVENT_KLASS(HT_EndiannessInfoEvent);
    HT_REGISTER_EVENT_KLASS(HT_Event);
    HT_REGISTER_EVENT_KLASS(HT_EventKlassInfoEvent);
    HT_REGISTER_EVENT_KLASS(HT_EventKlassFieldInfoEvent);
    HT_REGISTER_EVENT_KLASS(HT_CallstackBaseEvent);
    HT_REGISTER_EVENT_KLASS(HT_CallstackIntEvent);
    HT_REGISTER_EVENT_KLASS(HT_CallstackStringEvent);
    HT_REGISTER_EVENT_KLASS(HT_StringMappingEvent);
    HT_REGISTER_EVENT_KLASS(HT_SystemInfoEvent);

    ht_feature_register_core_features();

#ifdef HT_USE_PTHREADS
    _ht_posix_mapped_tracepoint_init();
#endif

    _ht_init_counter++;
}